

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O1

CaseResult * rc::detail::toCaseResult(CaseResult *__return_storage_ptr__,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 *puVar4;
  string *psVar5;
  string local_58;
  string local_38;
  
  sVar2 = value->_M_string_length;
  if (sVar2 == 0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Returned empty string","");
    CaseResult::CaseResult(__return_storage_ptr__,Success,&local_38);
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(value->_M_dataplus)._M_p;
    paVar1 = &value->field_2;
    if (paVar3 == paVar1) {
      local_58.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_58.field_2._8_8_ = *(undefined8 *)((long)&value->field_2 + 8);
    }
    else {
      local_58.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_58._M_dataplus._M_p = (pointer)paVar3;
    }
    (value->_M_dataplus)._M_p = (pointer)paVar1;
    value->_M_string_length = 0;
    (value->field_2)._M_local_buf[0] = '\0';
    local_58._M_string_length = sVar2;
    CaseResult::CaseResult(__return_storage_ptr__,Failure,&local_58);
  }
  if (sVar2 == 0) {
    psVar5 = &local_38;
  }
  else {
    psVar5 = &local_58;
  }
  puVar4 = (undefined1 *)(&(psVar5->field_2)._M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar4 != &psVar5->field_2) {
    operator_delete(puVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

CaseResult toCaseResult(std::string value) {
  return value.empty()
      ? CaseResult(CaseResult::Type::Success, "Returned empty string")
      : CaseResult(CaseResult::Type::Failure, std::move(value));
}